

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewChange.h
# Opt level: O0

void __thiscall
NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::AddOldVersion(NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *this,string *name,string *fileString,string *hashName)

{
  byte bVar1;
  char *__s;
  Logger *pLVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  ostream local_280 [8];
  ofstream file;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string folderPath;
  string *hashName_local;
  string *fileString_local;
  string *name_local;
  NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_local;
  
  folderPath.field_2._8_8_ = hashName;
  __s = (char *)std::__cxx11::string::data();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,__s,&local_69);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 &local_68,"/versions/");
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::operator+(&local_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 hashName);
  std::ofstream::ofstream(local_280,(string *)&local_2a0,_S_out);
  std::__cxx11::string::~string((string *)&local_2a0);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    pLVar2 = Logger::getInstance();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,anon_var_dwarf_730d,&local_2c1);
    Logger::LogError(pLVar2,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
  }
  poVar3 = (ostream *)std::ostream::operator<<(local_280,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar3,(string *)fileString);
  pLVar2 = Logger::getInstance();
  std::operator+(&local_2e8,anon_var_dwarf_7326,name);
  Logger::LogInformation(pLVar2,&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::ofstream::~ofstream(local_280);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

virtual void AddOldVersion(string name, string fileString, string hashName) {
        string folderPath = string(this->path->data()) + "/versions/";

        ofstream file(folderPath + hashName);
        if (!file.is_open()) {
            Logger::getInstance()->LogError("Ошибка при открытии файла");
        }
        file << endl << fileString;
        Logger::getInstance()->LogInformation("Добавена версия файла " + name);
    }